

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void myarimatest(void)

{
  int iVar1;
  FILE *__stream;
  double *x;
  myarima_object obj;
  uint N;
  undefined1 *puVar2;
  undefined1 local_25c8 [8];
  double temp [1200];
  int local_38 [2];
  int order [3];
  int rmethod;
  
  local_38[0] = 1;
  local_38[1] = 1;
  order[0] = 1;
  temp[0x4af] = 0.0;
  order[1] = 0;
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    N = 0;
    if (iVar1 == 0) {
      puVar2 = local_25c8;
      N = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",puVar2);
        iVar1 = feof(__stream);
        puVar2 = puVar2 + 8;
        N = N + 1;
      } while (iVar1 == 0);
    }
    x = (double *)malloc((ulong)N * 8);
    if (N != 0) {
      memcpy(x,local_25c8,(ulong)N << 3);
    }
    obj = myarima(x,N,local_38,(int *)(temp + 0x4af),0,"aic",0,0,0.0,(double *)0x0,0,order + 1);
    myarima_summary(obj);
    myarima_free(obj);
    free(x);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void myarimatest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	int drift,biasadj,method;
	double *xpred, *amse,*xreg,*newxreg;
	myarima_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 1;
	d = 1;
	q = 1;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[4] = {P,D,Q,s};
	const char *ic = "aic";
	int trace = 0;
	int constant = 0;
	int approx = 0;
	double offset = 0;
	int rmethod = 0;


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	drift = 1;
	biasadj = 0;
	method = 0;

	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	obj = myarima(inp,N,order,seasonal, constant, ic, trace, approx, offset,NULL, r, &rmethod) ;

	myarima_summary(obj);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	

	myarima_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}